

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O2

minisketch * minisketch_clone(minisketch *sketch)

{
  uint32_t bits;
  uint32_t implementation;
  long lVar1;
  size_t capacity;
  minisketch *pmVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Sketch::Check((Sketch *)sketch);
  bits = *(uint32_t *)(sketch + 0x14);
  implementation = *(uint32_t *)(sketch + 0x10);
  capacity = (**(code **)(*(long *)sketch + 0x10))(sketch);
  pmVar2 = minisketch_create(bits,implementation,capacity);
  if (pmVar2 != (minisketch *)0x0) {
    (**(code **)(*(long *)pmVar2 + 0x38))(pmVar2,sketch);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pmVar2;
  }
  __stack_chk_fail();
}

Assistant:

minisketch* minisketch_clone(const minisketch* sketch) {
    const Sketch* s = (const Sketch*)sketch;
    s->Check();
    Sketch* r = (Sketch*) minisketch_create(s->Bits(), s->Implementation(), s->Syndromes());
    if (r) {
        r->Merge(s);
    }
    return (minisketch*) r;
}